

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O3

int64_t av1_highbd_pixel_proj_error_avx2
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  
  lVar10 = (long)src8 * 2;
  lVar11 = (long)dat8 * 2;
  if (params->r[0] < 1) {
    lVar7 = 4;
    flt0 = flt1;
    flt0_stride = flt1_stride;
    if (0 < params->r[1]) goto LAB_00489dcb;
    iVar15 = 0;
    if (0 < height) {
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      lVar7 = 0;
      do {
        uVar14 = 0;
        auVar20 = ZEXT1664((undefined1  [16])0x0);
        auVar24 = auVar20._0_32_;
        if (0x1f < width) {
          lVar13 = 0;
          do {
            auVar24 = vpsubw_avx2(*(undefined1 (*) [32])(lVar11 + lVar13 * 2),
                                  *(undefined1 (*) [32])(lVar10 + lVar13 * 2));
            auVar23 = vpsubw_avx2(*(undefined1 (*) [32])(lVar11 + 0x20 + lVar13 * 2),
                                  *(undefined1 (*) [32])(lVar10 + 0x20 + lVar13 * 2));
            auVar24 = vpmaddwd_avx2(auVar24,auVar24);
            auVar24 = vpaddd_avx2(auVar24,auVar20._0_32_);
            auVar23 = vpmaddwd_avx2(auVar23,auVar23);
            auVar24 = vpaddd_avx2(auVar24,auVar23);
            auVar20 = ZEXT3264(auVar24);
            lVar13 = lVar13 + 0x20;
          } while (lVar13 <= (int)(width - 0x20U));
          uVar14 = (ulong)((width - 0x20U & 0xffffffe0) + 0x20);
        }
        iVar8 = (int)uVar14;
        while (iVar8 < width) {
          lVar13 = (ulong)*(ushort *)(lVar11 + uVar14 * 2) - (ulong)*(ushort *)(lVar10 + uVar14 * 2)
          ;
          lVar7 = lVar7 + lVar13 * lVar13;
          uVar14 = uVar14 + 1;
          iVar8 = (int)uVar14;
        }
        auVar23 = vpmovzxdq_avx2(auVar24._0_16_);
        auVar23 = vpaddq_avx2(auVar17._0_32_,auVar23);
        auVar24 = vpmovzxdq_avx2(auVar24._16_16_);
        auVar24 = vpaddq_avx2(auVar23,auVar24);
        auVar17 = ZEXT3264(auVar24);
        iVar15 = iVar15 + 1;
        lVar11 = lVar11 + (long)dat_stride * 2;
        lVar10 = lVar10 + (long)src_stride * 2;
      } while (iVar15 != height);
      goto LAB_00489f1e;
    }
  }
  else if (params->r[1] < 1) {
    lVar7 = 0;
LAB_00489dcb:
    iVar15 = 0;
    if (0 < height) {
      iVar8 = *(int *)((long)xq + lVar7);
      auVar23._4_4_ = iVar8;
      auVar23._0_4_ = iVar8;
      auVar23._8_4_ = iVar8;
      auVar23._12_4_ = iVar8;
      auVar23._16_4_ = iVar8;
      auVar23._20_4_ = iVar8;
      auVar23._24_4_ = iVar8;
      auVar23._28_4_ = iVar8;
      iVar9 = iVar8 * -0x10;
      auVar22._4_4_ = iVar9;
      auVar22._0_4_ = iVar9;
      auVar22._8_4_ = iVar9;
      auVar22._12_4_ = iVar9;
      auVar22._16_4_ = iVar9;
      auVar22._20_4_ = iVar9;
      auVar22._24_4_ = iVar9;
      auVar22._28_4_ = iVar9;
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      auVar25._8_4_ = 0x400;
      auVar25._0_8_ = 0x40000000400;
      auVar25._12_4_ = 0x400;
      auVar25._16_4_ = 0x400;
      auVar25._20_4_ = 0x400;
      auVar25._24_4_ = 0x400;
      auVar25._28_4_ = 0x400;
      lVar7 = 0;
      do {
        uVar14 = 0;
        auVar20 = ZEXT1664((undefined1  [16])0x0);
        auVar24 = auVar20._0_32_;
        if (0xf < width) {
          lVar13 = 0;
          do {
            auVar24 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar11 + 0x10 + lVar13 * 2));
            auVar18 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar11 + lVar13 * 2));
            auVar21 = vpmulld_avx2(auVar23,*(undefined1 (*) [32])(flt0 + lVar13 + 8));
            auVar19 = vpmulld_avx2(auVar23,*(undefined1 (*) [32])(flt0 + lVar13));
            auVar4 = vpmulld_avx2(auVar22,auVar24);
            auVar18 = vpmulld_avx2(auVar22,auVar18);
            auVar24 = vpaddd_avx2(auVar21,auVar25);
            auVar24 = vpaddd_avx2(auVar24,auVar4);
            auVar21 = vpsrad_avx2(auVar24,0xb);
            auVar24 = vpaddd_avx2(auVar19,auVar25);
            auVar24 = vpaddd_avx2(auVar24,auVar18);
            auVar24 = vpsrad_avx2(auVar24,0xb);
            auVar24 = vpackssdw_avx2(auVar24,auVar21);
            auVar18 = vpermq_avx2(auVar24,0xd8);
            auVar24 = vpsubw_avx2(*(undefined1 (*) [32])(lVar11 + lVar13 * 2),
                                  *(undefined1 (*) [32])(lVar10 + lVar13 * 2));
            auVar24 = vpaddw_avx2(auVar24,auVar18);
            auVar24 = vpmaddwd_avx2(auVar24,auVar24);
            auVar24 = vpaddd_avx2(auVar24,auVar20._0_32_);
            auVar20 = ZEXT3264(auVar24);
            lVar13 = lVar13 + 0x10;
          } while (lVar13 <= (int)(width - 0x10U));
          uVar14 = (ulong)((width - 0x10U & 0xfffffff0) + 0x10);
        }
        iVar9 = (int)uVar14;
        while (iVar9 < width) {
          uVar16 = (uint)*(ushort *)(lVar11 + uVar14 * 2);
          lVar13 = (long)(int)((uVar16 - *(ushort *)(lVar10 + uVar14 * 2)) +
                              ((int)((flt0[uVar14] + uVar16 * -0x10) * iVar8 + 0x400) >> 0xb));
          lVar7 = lVar7 + lVar13 * lVar13;
          uVar14 = uVar14 + 1;
          iVar9 = (int)uVar14;
        }
        auVar18 = vpmovzxdq_avx2(auVar24._0_16_);
        auVar18 = vpaddq_avx2(auVar17._0_32_,auVar18);
        auVar24 = vpmovzxdq_avx2(auVar24._16_16_);
        auVar24 = vpaddq_avx2(auVar18,auVar24);
        auVar17 = ZEXT3264(auVar24);
        iVar15 = iVar15 + 1;
        flt0 = flt0 + flt0_stride;
        lVar11 = lVar11 + (long)dat_stride * 2;
        lVar10 = lVar10 + (long)src_stride * 2;
      } while (iVar15 != height);
      goto LAB_00489f1e;
    }
  }
  else {
    iVar15 = 0;
    if (0 < height) {
      iVar8 = *xq;
      iVar9 = xq[1];
      auVar18._4_4_ = iVar8;
      auVar18._0_4_ = iVar8;
      auVar18._8_4_ = iVar8;
      auVar18._12_4_ = iVar8;
      auVar18._16_4_ = iVar8;
      auVar18._20_4_ = iVar8;
      auVar18._24_4_ = iVar8;
      auVar18._28_4_ = iVar8;
      auVar21._4_4_ = iVar9;
      auVar21._0_4_ = iVar9;
      auVar21._8_4_ = iVar9;
      auVar21._12_4_ = iVar9;
      auVar21._16_4_ = iVar9;
      auVar21._20_4_ = iVar9;
      auVar21._24_4_ = iVar9;
      auVar21._28_4_ = iVar9;
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      auVar19._8_4_ = 0x400;
      auVar19._0_8_ = 0x40000000400;
      auVar19._12_4_ = 0x400;
      auVar19._16_4_ = 0x400;
      auVar19._20_4_ = 0x400;
      auVar19._24_4_ = 0x400;
      auVar19._28_4_ = 0x400;
      lVar7 = 0;
      do {
        uVar14 = 0;
        auVar20 = ZEXT1664((undefined1  [16])0x0);
        auVar24 = auVar20._0_32_;
        if (0xf < width) {
          lVar13 = 0;
          do {
            auVar24 = *(undefined1 (*) [32])(lVar11 + lVar13 * 2);
            auVar22 = vpsllw_avx2(auVar24,4);
            auVar23 = vpmovzxwd_avx2(auVar22._0_16_);
            auVar22 = vpmovzxwd_avx2(auVar22._16_16_);
            auVar25 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar13),auVar23);
            auVar4 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar13 + 8),auVar22);
            auVar5 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar13),auVar23);
            auVar6 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar13 + 8),auVar22);
            auVar23 = vpmulld_avx2(auVar25,auVar18);
            auVar22 = vpmulld_avx2(auVar4,auVar18);
            auVar25 = vpmulld_avx2(auVar5,auVar21);
            auVar23 = vpaddd_avx2(auVar23,auVar25);
            auVar25 = vpmulld_avx2(auVar6,auVar21);
            auVar22 = vpaddd_avx2(auVar22,auVar25);
            auVar23 = vpaddd_avx2(auVar23,auVar19);
            auVar25 = vpsrad_avx2(auVar23,0xb);
            auVar23 = vpaddd_avx2(auVar22,auVar19);
            auVar23 = vpsrad_avx2(auVar23,0xb);
            auVar23 = vpackssdw_avx2(auVar25,auVar23);
            auVar23 = vpermq_avx2(auVar23,0xd8);
            auVar24 = vpsubw_avx2(auVar24,*(undefined1 (*) [32])(lVar10 + lVar13 * 2));
            auVar24 = vpaddw_avx2(auVar24,auVar23);
            auVar24 = vpmaddwd_avx2(auVar24,auVar24);
            auVar24 = vpaddd_avx2(auVar24,auVar20._0_32_);
            auVar20 = ZEXT3264(auVar24);
            lVar13 = lVar13 + 0x10;
          } while (lVar13 <= (int)(width - 0x10U));
          uVar14 = (ulong)((width - 0x10U & 0xfffffff0) + 0x10);
        }
        iVar12 = (int)uVar14;
        while (iVar12 < width) {
          uVar1 = *(ushort *)(lVar11 + uVar14 * 2);
          lVar13 = (long)(int)(((uint)uVar1 - (uint)*(ushort *)(lVar10 + uVar14 * 2)) +
                              ((int)((flt1[uVar14] + (uint)uVar1 * -0x10) * iVar9 +
                                     (flt0[uVar14] + (uint)uVar1 * -0x10) * iVar8 + 0x400) >> 0xb));
          lVar7 = lVar7 + lVar13 * lVar13;
          uVar14 = uVar14 + 1;
          iVar12 = (int)uVar14;
        }
        auVar23 = vpmovzxdq_avx2(auVar24._0_16_);
        auVar23 = vpaddq_avx2(auVar17._0_32_,auVar23);
        auVar24 = vpmovzxdq_avx2(auVar24._16_16_);
        auVar24 = vpaddq_avx2(auVar23,auVar24);
        auVar17 = ZEXT3264(auVar24);
        iVar15 = iVar15 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        lVar11 = lVar11 + (long)dat_stride * 2;
        lVar10 = lVar10 + (long)src_stride * 2;
      } while (iVar15 != height);
      goto LAB_00489f1e;
    }
  }
  auVar24 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  lVar7 = 0;
LAB_00489f1e:
  auVar2 = vpaddq_avx(auVar24._0_16_,auVar24._16_16_);
  auVar3 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddq_avx(auVar2,auVar3);
  return auVar2._0_8_ + lVar7;
}

Assistant:

int64_t av1_highbd_pixel_proj_error_avx2(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m256i rounding = _mm256_set1_epi32(1 << (shift - 1));
  __m256i sum64 = _mm256_setzero_si256();
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {  // Both filters are enabled
    const __m256i xq0 = _mm256_set1_epi32(xq[0]);
    const __m256i xq1 = _mm256_set1_epi32(xq[1]);
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 16; j += 16) {  // Process 16 pixels at a time
        // Load 16 pixels each from source image and corrupted image
        const __m256i s0 = yy_loadu_256(src + j);
        const __m256i d0 = yy_loadu_256(dat + j);
        // s0 = [15 14 13 12 11 10 9 8] [7 6 5 4 3 2 1 0] as u16 (indices)

        // Shift-up each pixel to match filtered image scaling
        const __m256i u0 = _mm256_slli_epi16(d0, SGRPROJ_RST_BITS);

        // Split u0 into two halves and pad each from u16 to i32
        const __m256i u0l = _mm256_cvtepu16_epi32(_mm256_castsi256_si128(u0));
        const __m256i u0h =
            _mm256_cvtepu16_epi32(_mm256_extracti128_si256(u0, 1));
        // u0h, u0l = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0] as u32

        // Load 16 pixels from each filtered image
        const __m256i flt0l = yy_loadu_256(flt0 + j);
        const __m256i flt0h = yy_loadu_256(flt0 + j + 8);
        const __m256i flt1l = yy_loadu_256(flt1 + j);
        const __m256i flt1h = yy_loadu_256(flt1 + j + 8);
        // flt?l, flt?h = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0] as u32

        // Subtract shifted corrupt image from each filtered image
        const __m256i flt0l_subu = _mm256_sub_epi32(flt0l, u0l);
        const __m256i flt0h_subu = _mm256_sub_epi32(flt0h, u0h);
        const __m256i flt1l_subu = _mm256_sub_epi32(flt1l, u0l);
        const __m256i flt1h_subu = _mm256_sub_epi32(flt1h, u0h);

        // Multiply basis vectors by appropriate coefficients
        const __m256i v0l = _mm256_mullo_epi32(flt0l_subu, xq0);
        const __m256i v0h = _mm256_mullo_epi32(flt0h_subu, xq0);
        const __m256i v1l = _mm256_mullo_epi32(flt1l_subu, xq1);
        const __m256i v1h = _mm256_mullo_epi32(flt1h_subu, xq1);

        // Add together the contributions from the two basis vectors
        const __m256i vl = _mm256_add_epi32(v0l, v1l);
        const __m256i vh = _mm256_add_epi32(v0h, v1h);

        // Right-shift v with appropriate rounding
        const __m256i vrl =
            _mm256_srai_epi32(_mm256_add_epi32(vl, rounding), shift);
        const __m256i vrh =
            _mm256_srai_epi32(_mm256_add_epi32(vh, rounding), shift);
        // vrh, vrl = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0]

        // Saturate each i32 to an i16 then combine both halves
        // The permute (control=[3 1 2 0]) fixes weird ordering from AVX lanes
        const __m256i vr =
            _mm256_permute4x64_epi64(_mm256_packs_epi32(vrl, vrh), 0xd8);
        // intermediate = [15 14 13 12 7 6 5 4] [11 10 9 8 3 2 1 0]
        // vr = [15 14 13 12 11 10 9 8] [7 6 5 4 3 2 1 0]

        // Add twin-subspace-sgr-filter to corrupt image then subtract source
        const __m256i e0 = _mm256_sub_epi16(_mm256_add_epi16(vr, d0), s0);

        // Calculate squared error and add adjacent values
        const __m256i err0 = _mm256_madd_epi16(e0, e0);

        sum32 = _mm256_add_epi32(sum32, err0);
      }

      const __m256i sum32l =
          _mm256_cvtepu32_epi64(_mm256_castsi256_si128(sum32));
      sum64 = _mm256_add_epi64(sum64, sum32l);
      const __m256i sum32h =
          _mm256_cvtepu32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum32h);

      // Process remaining pixels in this row (modulo 16)
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {  // Only one filter enabled
    const int32_t xq_on = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m256i xq_active = _mm256_set1_epi32(xq_on);
    const __m256i xq_inactive =
        _mm256_set1_epi32(-xq_on * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 16; j += 16) {
        // Load 16 pixels from source image
        const __m256i s0 = yy_loadu_256(src + j);
        // s0 = [15 14 13 12 11 10 9 8] [7 6 5 4 3 2 1 0] as u16

        // Load 16 pixels from corrupted image and pad each u16 to i32
        const __m256i d0 = yy_loadu_256(dat + j);
        const __m256i d0h =
            _mm256_cvtepu16_epi32(_mm256_extracti128_si256(d0, 1));
        const __m256i d0l = _mm256_cvtepu16_epi32(_mm256_castsi256_si128(d0));
        // d0 = [15 14 13 12 11 10 9 8] [7 6 5 4 3 2 1 0] as u16
        // d0h, d0l = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0] as i32

        // Load 16 pixels from the filtered image
        const __m256i flth = yy_loadu_256(flt + j + 8);
        const __m256i fltl = yy_loadu_256(flt + j);
        // flth, fltl = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0] as i32

        const __m256i flth_xq = _mm256_mullo_epi32(flth, xq_active);
        const __m256i fltl_xq = _mm256_mullo_epi32(fltl, xq_active);
        const __m256i d0h_xq = _mm256_mullo_epi32(d0h, xq_inactive);
        const __m256i d0l_xq = _mm256_mullo_epi32(d0l, xq_inactive);

        const __m256i vh = _mm256_add_epi32(flth_xq, d0h_xq);
        const __m256i vl = _mm256_add_epi32(fltl_xq, d0l_xq);

        // Shift this down with appropriate rounding
        const __m256i vrh =
            _mm256_srai_epi32(_mm256_add_epi32(vh, rounding), shift);
        const __m256i vrl =
            _mm256_srai_epi32(_mm256_add_epi32(vl, rounding), shift);
        // vrh, vrl = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0] as i32

        // Saturate each i32 to an i16 then combine both halves
        // The permute (control=[3 1 2 0]) fixes weird ordering from AVX lanes
        const __m256i vr =
            _mm256_permute4x64_epi64(_mm256_packs_epi32(vrl, vrh), 0xd8);
        // intermediate = [15 14 13 12 7 6 5 4] [11 10 9 8 3 2 1 0] as u16
        // vr = [15 14 13 12 11 10 9 8] [7 6 5 4 3 2 1 0] as u16

        // Subtract twin-subspace-sgr filtered from source image to get error
        const __m256i e0 = _mm256_sub_epi16(_mm256_add_epi16(vr, d0), s0);

        // Calculate squared error and add adjacent values
        const __m256i err0 = _mm256_madd_epi16(e0, e0);

        sum32 = _mm256_add_epi32(sum32, err0);
      }

      const __m256i sum32l =
          _mm256_cvtepu32_epi64(_mm256_castsi256_si128(sum32));
      sum64 = _mm256_add_epi64(sum64, sum32l);
      const __m256i sum32h =
          _mm256_cvtepu32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum32h);

      // Process remaining pixels in this row (modulo 16)
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_on * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
    }
  } else {  // Neither filter is enabled
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 32; j += 32) {
        // Load 2x16 u16 from source image
        const __m256i s0l = yy_loadu_256(src + j);
        const __m256i s0h = yy_loadu_256(src + j + 16);

        // Load 2x16 u16 from corrupted image
        const __m256i d0l = yy_loadu_256(dat + j);
        const __m256i d0h = yy_loadu_256(dat + j + 16);

        // Subtract corrupted image from source image
        const __m256i diffl = _mm256_sub_epi16(d0l, s0l);
        const __m256i diffh = _mm256_sub_epi16(d0h, s0h);

        // Square error and add adjacent values
        const __m256i err0l = _mm256_madd_epi16(diffl, diffl);
        const __m256i err0h = _mm256_madd_epi16(diffh, diffh);

        sum32 = _mm256_add_epi32(sum32, err0l);
        sum32 = _mm256_add_epi32(sum32, err0h);
      }

      const __m256i sum32l =
          _mm256_cvtepu32_epi64(_mm256_castsi256_si128(sum32));
      sum64 = _mm256_add_epi64(sum64, sum32l);
      const __m256i sum32h =
          _mm256_cvtepu32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum32h);

      // Process remaining pixels (modulu 16)
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }

  // Sum 4 values from sum64l and sum64h into err
  int64_t sum[4];
  yy_storeu_256(sum, sum64);
  err += sum[0] + sum[1] + sum[2] + sum[3];
  return err;
}